

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall tinyusdz::primvar::PrimVar::is_valid(PrimVar *this)

{
  bool bVar1;
  uint32_t uVar2;
  PrimVar *this_local;
  
  bVar1 = has_timesamples(this);
  if (bVar1) {
    uVar2 = tinyusdz::value::TimeSamples::type_id(&this->_ts);
    if ((uVar2 != 0) && (uVar2 = tinyusdz::value::TimeSamples::type_id(&this->_ts), uVar2 != 1)) {
      return true;
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = has_value(this);
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid() const {
    if (has_timesamples()) {
      if ((_ts.type_id() == value::TypeId::TYPE_ID_INVALID) || (_ts.type_id() == value::TypeId::TYPE_ID_NULL)) {
        return false;
      }

      // TODO: Check if the type of timesamples is the same with the type of 'default' value
      return true;
    }

    // TODO: Make blocked valid?

    return has_value();
  }